

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArray.h
# Opt level: O2

void __thiscall
COLLADAFW::Array<COLLADAFW::TextureCoordinateBinding>::releaseMemory
          (Array<COLLADAFW::TextureCoordinateBinding> *this)

{
  TextureCoordinateBinding *pTVar1;
  long lVar2;
  long lVar3;
  
  pTVar1 = this->mData;
  if (pTVar1 != (TextureCoordinateBinding *)0x0) {
    lVar2 = *(long *)((long)&pTVar1[-1].mSemantic.field_2 + 8);
    if (lVar2 != 0) {
      lVar3 = lVar2 * 0x38;
      do {
        TextureCoordinateBinding::~TextureCoordinateBinding
                  ((TextureCoordinateBinding *)
                   ((long)&pTVar1[-1]._vptr_TextureCoordinateBinding + lVar3));
        lVar3 = lVar3 + -0x38;
      } while (lVar3 != 0);
    }
    operator_delete__((void *)((long)&pTVar1[-1].mSemantic.field_2 + 8),lVar2 * 0x38 + 8);
  }
  this->mData = (TextureCoordinateBinding *)0x0;
  this->mCount = 0;
  this->mCapacity = 0;
  return;
}

Assistant:

virtual void releaseMemory ()
        {
            delete[] mData;
            setData ( 0, 0, 0 );
        }